

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O2

int envy_bios_parse_inputdev(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  envy_bios_inputdev_entry *peVar9;
  uint len;
  ulong uVar10;
  char *__format;
  ulong uVar11;
  long lVar12;
  
  uVar2 = (bios->inputdev).offset;
  if (uVar2 == 0) {
LAB_00253671:
    iVar4 = 0;
  }
  else {
    bVar1 = (bios->dcb).version;
    if (bVar1 < 0x30) {
      (bios->inputdev).version = bVar1;
      (bios->inputdev).hlen = '\0';
      (bios->inputdev).entriesnum = '\b';
      (bios->inputdev).rlen = '\x01';
      len = 8;
      uVar8 = 0;
    }
    else {
      iVar4 = bios_u8(bios,(uint)uVar2,&(bios->inputdev).version);
      iVar5 = bios_u8(bios,(bios->inputdev).offset + 1,&(bios->inputdev).hlen);
      iVar6 = bios_u8(bios,(bios->inputdev).offset + 2,&(bios->inputdev).entriesnum);
      iVar7 = bios_u8(bios,(bios->inputdev).offset + 3,&(bios->inputdev).rlen);
      if (iVar7 != 0 || (iVar6 != 0 || (iVar5 != 0 || iVar4 != 0))) {
        return -0xe;
      }
      uVar2 = (bios->inputdev).offset;
      len = (uint)(bios->inputdev).entriesnum * (uint)(bios->inputdev).rlen +
            (uint)(bios->inputdev).hlen;
      uVar8 = 4;
    }
    envy_bios_block(bios,(uint)uVar2,len,"INPUTDEV",-1);
    bVar1 = (bios->inputdev).version;
    if ((bVar1 - 0x20 < 0x21) && ((0x100010007U >> ((ulong)(bVar1 - 0x20) & 0x3f) & 1) != 0)) {
      bVar1 = (bios->inputdev).hlen;
      uVar10 = (ulong)bVar1;
      if (bVar1 < uVar8) {
        __format = "INPUTDEV table header too short [%d < %d]\n";
        uVar11 = (ulong)uVar8;
      }
      else {
        bVar3 = (bios->inputdev).rlen;
        if (bVar3 != 0) {
          if (uVar8 < bVar1) {
            fprintf(_stderr,"INPUTDEV table header longer than expected [%d > %d]\n",uVar10,
                    (ulong)uVar8);
            bVar3 = (bios->inputdev).rlen;
          }
          if (1 < bVar3) {
            fprintf(_stderr,"INPUTDEV table record longer than expected [%d > %d]\n",(ulong)bVar3,1)
            ;
          }
          peVar9 = (envy_bios_inputdev_entry *)calloc((ulong)(bios->inputdev).entriesnum,4);
          (bios->inputdev).entries = peVar9;
          if (peVar9 == (envy_bios_inputdev_entry *)0x0) {
            return -0xc;
          }
          lVar12 = 2;
          uVar11 = 0;
          while (uVar11 < (bios->inputdev).entriesnum) {
            peVar9 = (bios->inputdev).entries;
            uVar8 = (uint)(bios->inputdev).rlen * (int)uVar11 +
                    (uint)(bios->inputdev).hlen + (uint)(bios->inputdev).offset;
            *(short *)((long)peVar9 + lVar12 + -2) = (short)uVar8;
            iVar4 = bios_u8(bios,uVar8 & 0xffff,(uint8_t *)((long)&peVar9->offset + lVar12));
            uVar11 = uVar11 + 1;
            lVar12 = lVar12 + 4;
            if (iVar4 != 0) {
              return -0xe;
            }
          }
          (bios->inputdev).valid = '\x01';
          goto LAB_00253671;
        }
        __format = "INPUTDEV table record too short [%d < %d]\n";
        uVar11 = 1;
        uVar10 = 0;
      }
    }
    else {
      uVar10 = (ulong)(bVar1 >> 4);
      uVar11 = (ulong)(bVar1 & 0xf);
      __format = "Unknown INPUTDEV table version %d.%d\n";
    }
    fprintf(_stderr,__format,uVar10,uVar11);
    iVar4 = -0x16;
  }
  return iVar4;
}

Assistant:

int envy_bios_parse_inputdev (struct envy_bios *bios) {
	struct envy_bios_inputdev *inputdev = &bios->inputdev;
	if (!inputdev->offset)
		return 0;
	int err = 0;
	int wanthlen = 4;
	int wantrlen = 1;
	if (bios->dcb.version >= 0x30) {
		err |= bios_u8(bios, inputdev->offset, &inputdev->version);
		err |= bios_u8(bios, inputdev->offset+1, &inputdev->hlen);
		err |= bios_u8(bios, inputdev->offset+2, &inputdev->entriesnum);
		err |= bios_u8(bios, inputdev->offset+3, &inputdev->rlen);
	} else {
		inputdev->version = bios->dcb.version;
		wanthlen = inputdev->hlen = 0;
		inputdev->entriesnum = 8;
		inputdev->rlen = 1;
	}
	if (err)
		return -EFAULT;
	envy_bios_block(bios, inputdev->offset, inputdev->hlen + inputdev->rlen * inputdev->entriesnum, "INPUTDEV", -1);
	switch (inputdev->version) {
		case 0x20:
		case 0x21:
		case 0x22:
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown INPUTDEV table version %d.%d\n", inputdev->version >> 4, inputdev->version & 0xf);
			return -EINVAL;
	}
	if (inputdev->hlen < wanthlen) {
		ENVY_BIOS_ERR("INPUTDEV table header too short [%d < %d]\n", inputdev->hlen, wanthlen);
		return -EINVAL;
	}
	if (inputdev->rlen < wantrlen) {
		ENVY_BIOS_ERR("INPUTDEV table record too short [%d < %d]\n", inputdev->rlen, wantrlen);
		return -EINVAL;
	}
	if (inputdev->hlen > wanthlen) {
		ENVY_BIOS_WARN("INPUTDEV table header longer than expected [%d > %d]\n", inputdev->hlen, wanthlen);
	}
	if (inputdev->rlen > wantrlen) {
		ENVY_BIOS_WARN("INPUTDEV table record longer than expected [%d > %d]\n", inputdev->rlen, wantrlen);
	}
	inputdev->entries = calloc(inputdev->entriesnum, sizeof *inputdev->entries);
	if (!inputdev->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < inputdev->entriesnum; i++) {
		struct envy_bios_inputdev_entry *entry = &inputdev->entries[i];
		entry->offset = inputdev->offset + inputdev->hlen + inputdev->rlen * i;
		err |= bios_u8(bios, entry->offset, &entry->entry);
		if (err)
			return -EFAULT;
	}
	inputdev->valid = 1;
	return 0;
}